

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O0

void __thiscall TasGrid::GridWavelet::clearRefinement(GridWavelet *this)

{
  MultiIndexSet local_38;
  GridWavelet *local_10;
  GridWavelet *this_local;
  
  local_10 = this;
  MultiIndexSet::MultiIndexSet(&local_38);
  MultiIndexSet::operator=(&(this->super_BaseCanonicalGrid).needed,&local_38);
  MultiIndexSet::~MultiIndexSet(&local_38);
  return;
}

Assistant:

void GridWavelet::clearRefinement(){ needed = MultiIndexSet(); }